

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O1

void __thiscall
pstack::Dwarf::DIE::Raw::Raw(Raw *this,Unit *unit,DWARFReader *r,size_t abbrev,Off parent_)

{
  pointer pFVar1;
  Abbreviation *pAVar2;
  element_type *peVar3;
  FormEntry *form;
  pointer __args_1;
  long lVar4;
  Unit *local_40;
  Unit *unit_local;
  
  local_40 = unit;
  unit_local = (Unit *)r;
  pAVar2 = Unit::findAbbreviation(unit,abbrev);
  this->type = pAVar2;
  (this->values).
  super__Vector_base<pstack::Dwarf::DIE::Attribute::Value,_std::allocator<pstack::Dwarf::DIE::Attribute::Value>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).
  super__Vector_base<pstack::Dwarf::DIE::Attribute::Value,_std::allocator<pstack::Dwarf::DIE::Attribute::Value>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).
  super__Vector_base<pstack::Dwarf::DIE::Attribute::Value,_std::allocator<pstack::Dwarf::DIE::Attribute::Value>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->parent = parent_;
  this->firstChild = 0;
  this->nextSibling = 0;
  std::
  vector<pstack::Dwarf::DIE::Attribute::Value,_std::allocator<pstack::Dwarf::DIE::Attribute::Value>_>
  ::reserve(&this->values,
            (long)(pAVar2->forms).
                  super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pAVar2->forms).
                  super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
  __args_1 = (this->type->forms).
             super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->type->forms).
           super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args_1 != pFVar1) {
    lVar4 = 0;
    do {
      std::
      vector<pstack::Dwarf::DIE::Attribute::Value,std::allocator<pstack::Dwarf::DIE::Attribute::Value>>
      ::
      emplace_back<pstack::Dwarf::DWARFReader&,pstack::Dwarf::FormEntry_const&,pstack::Dwarf::Unit*&>
                ((vector<pstack::Dwarf::DIE::Attribute::Value,std::allocator<pstack::Dwarf::DIE::Attribute::Value>>
                  *)&this->values,(DWARFReader *)unit_local,__args_1,&local_40);
      if ((int)lVar4 == this->type->nextSibIdx) {
        this->nextSibling =
             (long)&((this->values).
                     super__Vector_base<pstack::Dwarf::DIE::Attribute::Value,_std::allocator<pstack::Dwarf::DIE::Attribute::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar4].block)->offset +
             local_40->offset;
      }
      lVar4 = lVar4 + 1;
      __args_1 = __args_1 + 1;
    } while (__args_1 != pFVar1);
  }
  peVar3 = (unit_local->super_enable_shared_from_this<pstack::Dwarf::Unit>)._M_weak_this.
           super___weak_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this->type->hasChildren == false) {
    this->nextSibling = (Off)peVar3;
    peVar3 = (element_type *)0x0;
  }
  this->firstChild = (Off)peVar3;
  return;
}

Assistant:

DIE::Raw::Raw(Unit *unit, DWARFReader &r, size_t abbrev, Elf::Off parent_)
    : type(unit->findAbbreviation(abbrev))
    , parent(parent_)
    , firstChild(0)
    , nextSibling(0)
{
    size_t i = 0;
    values.reserve(type->forms.size());
    for (auto &form : type->forms) {
        values.emplace_back(r, form, unit);
        if (int(i) == type->nextSibIdx)
            nextSibling = values[i].sdata + unit->offset;
        ++i;
    }
    if (type->hasChildren) {
        // If the type has children, last offset read is the first child.
        firstChild = r.getOffset();
    } else {
        nextSibling = r.getOffset(); // we have no children, so next DIE is next sib
        firstChild = 0; // no children.
    }
}